

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParserEntityCheck(xmlParserCtxtPtr ctxt,unsigned_long extra)

{
  xmlParserInputPtr pxVar1;
  xmlEntityPtr pxVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  
  pxVar1 = ctxt->input;
  pxVar2 = pxVar1->entity;
  if ((pxVar2 == (xmlEntityPtr)0x0) || ((pxVar2->flags & 2) == 0)) {
    uVar3 = (long)pxVar1->cur - (long)pxVar1->base;
    uVar4 = uVar3 + pxVar1->consumed;
    if (CARRY8(uVar3,pxVar1->consumed)) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar3 = uVar4 + ctxt->sizeentities;
    if (CARRY8(uVar4,ctxt->sizeentities)) {
      uVar3 = 0xffffffffffffffff;
    }
    puVar6 = &pxVar2->expandedSize;
    if (pxVar2 == (xmlEntityPtr)0x0) {
      puVar6 = &ctxt->sizeentcopy;
    }
    uVar4 = extra + *puVar6;
    if (CARRY8(extra,*puVar6)) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar5 = uVar4 + 0x14;
    if (0xffffffffffffffeb < uVar4) {
      uVar5 = 0xffffffffffffffff;
    }
    *puVar6 = uVar5;
    if (1000000 < uVar5) {
      if ((uVar5 != 0xffffffffffffffff) && (uVar5 / ctxt->maxAmpl <= uVar3)) {
        return 0;
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Maximum entity amplification factor exceeded, see xmlCtxtSetMaxAmplification.\n");
      xmlHaltParser(ctxt);
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlParserEntityCheck(xmlParserCtxtPtr ctxt, unsigned long extra)
{
    unsigned long consumed;
    unsigned long *expandedSize;
    xmlParserInputPtr input = ctxt->input;
    xmlEntityPtr entity = input->entity;

    if ((entity) && (entity->flags & XML_ENT_CHECKED))
        return(0);

    /*
     * Compute total consumed bytes so far, including input streams of
     * external entities.
     */
    consumed = input->consumed;
    xmlSaturatedAddSizeT(&consumed, input->cur - input->base);
    xmlSaturatedAdd(&consumed, ctxt->sizeentities);

    if (entity)
        expandedSize = &entity->expandedSize;
    else
        expandedSize = &ctxt->sizeentcopy;

    /*
     * Add extra cost and some fixed cost.
     */
    xmlSaturatedAdd(expandedSize, extra);
    xmlSaturatedAdd(expandedSize, XML_ENT_FIXED_COST);

    /*
     * It's important to always use saturation arithmetic when tracking
     * entity sizes to make the size checks reliable. If "sizeentcopy"
     * overflows, we have to abort.
     */
    if ((*expandedSize > XML_PARSER_ALLOWED_EXPANSION) &&
        ((*expandedSize >= ULONG_MAX) ||
         (*expandedSize / ctxt->maxAmpl > consumed))) {
        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity amplification factor exceeded, see "
                       "xmlCtxtSetMaxAmplification.\n");
        xmlHaltParser(ctxt);
        return(1);
    }

    return(0);
}